

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::AddVariables
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,NLHeader *h)

{
  int iVar1;
  int iVar2;
  Error *this_00;
  int iVar3;
  int iVar4;
  int k;
  
  k = 0;
  iVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
  iVar4 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs;
  if (iVar4 < iVar1) {
    iVar4 = iVar1;
  }
  if (iVar4 != 0) {
    DoAddVars(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both -
                   (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both,
              CONTINUOUS,&k);
    DoAddVars(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both,
              INTEGER,&k);
    DoAddVars(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons -
                   ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both +
                   (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons),
              CONTINUOUS,&k);
    DoAddVars(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons,
              INTEGER,&k);
    iVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs;
    iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
    iVar3 = iVar1 - iVar2;
    if (iVar3 != 0 && iVar2 <= iVar1) {
      DoAddVars(this,iVar3 - (h->super_NLProblemInfo).super_NLProblemInfo_C.
                             num_nl_integer_vars_in_objs,CONTINUOUS,&k);
      DoAddVars(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs,
                INTEGER,&k);
    }
  }
  if (iVar4 == k) {
    DoAddVars(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_vars -
                   (iVar4 + (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars +
                   (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars),CONTINUOUS
              ,&k);
    DoAddVars(this,(h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars +
                   (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars,INTEGER,&k
             );
    if ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_vars == k) {
      return;
    }
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x15a437,-1);
  }
  else {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x15a410,-1);
  }
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void AddVariables(const NLHeader& h) {
    // Distinguish NL variable order
    // See D.M.Gay, Hooking Your Solver to AMPL;
    //     D.M.Gay, Writing .NL Files;
    // and, e.g.,
    // github.com/jump-dev/MathOptInterface.jl/blob/master/src/FileFormats/NL/README.md
    int k=0;                             // current block position
    const int num_nl_vars = std::max(h.num_nl_vars_in_cons,
                                     h.num_nl_vars_in_objs);
    if (num_nl_vars) {
      DoAddVars(h.num_nl_vars_in_both - h.num_nl_integer_vars_in_both,
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_both,
              var::INTEGER, k);
      DoAddVars(h.num_nl_vars_in_cons -
              (h.num_nl_vars_in_both + h.num_nl_integer_vars_in_cons),
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_cons,
              var::INTEGER, k);
      int num_nl_vars_in_objs_only =
          std::max(0, h.num_nl_vars_in_objs - h.num_nl_vars_in_cons);
      if (num_nl_vars_in_objs_only) {
        DoAddVars(num_nl_vars_in_objs_only - h.num_nl_integer_vars_in_objs,
                var::CONTINUOUS, k);
        DoAddVars(h.num_nl_integer_vars_in_objs,
                var::INTEGER, k);
      }
    }
    MP_ASSERT_ALWAYS(num_nl_vars == k, "NLProblemBuilder: num_nl_vars mismatch");
    DoAddVars(h.num_vars -
            (num_nl_vars +
             h.num_linear_integer_vars + h.num_linear_binary_vars),
            var::CONTINUOUS, k);
    DoAddVars(h.num_linear_integer_vars + h.num_linear_binary_vars,
            var::INTEGER, k);
    MP_ASSERT_ALWAYS(h.num_vars == k, "NLProblemBuilder: num_vars mismatch");
  }